

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

CBString * __thiscall
TreeModel::headerData
          (CBString *__return_storage_ptr__,TreeModel *this,int section,int orientation,int role)

{
  int role_local;
  int orientation_local;
  int section_local;
  TreeModel *this_local;
  
  if ((orientation == 1) && (role == 0)) {
    switch(section) {
    case 0:
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Name");
      break;
    case 1:
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Action");
      break;
    case 2:
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Type");
      break;
    case 3:
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Subtype");
      break;
    case 4:
      Bstrlib::CBString::CBString(__return_storage_ptr__,"Text");
      break;
    default:
      goto switchD_0014ecf4_default;
    }
  }
  else {
switchD_0014ecf4_default:
    Bstrlib::CBString::CBString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UString TreeModel::headerData(int section, int orientation,
                              int role) const
{
    if (orientation == 1 && role == 0) {
        switch (section)
        {
            case 0: return UString("Name");
            case 1: return UString("Action");
            case 2: return UString("Type");
            case 3: return UString("Subtype");
            case 4: return UString("Text");
        }
    }
    
    return UString();
}